

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynlib_unix.cpp
# Opt level: O1

void __thiscall trun::DynLibLinux::DynLibLinux(DynLibLinux *this)

{
  _Rb_tree_header *p_Var1;
  Version VVar2;
  ILogger *pIVar3;
  string local_40;
  
  (this->super_IDynLibrary)._vptr_IDynLibrary = (_func_int **)&PTR__IDynLibrary_001e1f50;
  (this->super_IDynLibrary).rawVersion = 0x474e4b5f30313030;
  VVar2 = TestLibVersion::FromVersion(0x474e4b5f30313030);
  (this->super_IDynLibrary).version = VVar2;
  (this->super_IDynLibrary)._vptr_IDynLibrary = (_func_int **)&PTR__DynLibLinux_001e1ee0;
  (this->pathName)._M_dataplus._M_p = (pointer)&(this->pathName).field_2;
  (this->pathName)._M_string_length = 0;
  (this->pathName).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->symbols)._M_t._M_impl.super__Rb_tree_header;
  (this->symbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->symbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->handle = (void *)0x0;
  this->pLogger = (ILogger *)0x0;
  (this->exports).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->exports).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->exports).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->symbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->symbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->symbols)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Loader","");
  pIVar3 = gnilk::Logger::GetLogger(&local_40);
  this->pLogger = pIVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

DynLibLinux::DynLibLinux() {
    this->pLogger = gnilk::Logger::GetLogger("Loader");
}